

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Version::MergeFrom(Version *this,Version *from)

{
  uint uVar1;
  LogMessage *other;
  string *default_value;
  InternalMetadataWithArena *this_00;
  LogFinisher local_c5;
  uint32 cached_has_bits;
  byte local_b1;
  LogMessage local_b0;
  Version *local_78;
  Version *from_local;
  Version *this_local;
  InternalMetadataWithArena *local_60;
  undefined4 local_44;
  HasBits<1UL> *local_40;
  InternalMetadataWithArena *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_b1 = 0;
  local_78 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x215);
    local_b1 = 1;
    other = internal::LogMessage::operator<<(&local_b0,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_c5,other);
  }
  if ((local_b1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b0);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (Version *)&local_78->_internal_metadata_;
  local_60 = this_00;
  local_38 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom(this_00,&local_28->unknown_fields);
  }
  local_40 = &local_78->_has_bits_;
  local_44 = 0;
  uVar1 = local_40->has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_suffix(this);
      default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->suffix_,default_value,(local_78->suffix_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      this->major_ = local_78->major_;
    }
    if ((uVar1 & 4) != 0) {
      this->minor_ = local_78->minor_;
    }
    if ((uVar1 & 8) != 0) {
      this->patch_ = local_78->patch_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void Version::MergeFrom(const Version& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.Version)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 15u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_suffix();
      suffix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.suffix_);
    }
    if (cached_has_bits & 0x00000002u) {
      major_ = from.major_;
    }
    if (cached_has_bits & 0x00000004u) {
      minor_ = from.minor_;
    }
    if (cached_has_bits & 0x00000008u) {
      patch_ = from.patch_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}